

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O2

FunctionInfo * __thiscall
InliningDecider::Inline
          (InliningDecider *this,FunctionBody *inliner,FunctionInfo *functionInfo,
          bool isConstructorCall,bool isPolymorphicCall,bool isCallback,uint16 constantArgInfo,
          ProfileId callSiteId,uint recursiveInlineDepth,bool allowRecursiveInlining)

{
  ushort uVar1;
  FunctionProxy *this_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  FunctionBody *pFVar9;
  undefined4 *puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char16 *pcVar13;
  ByteBlock *pBVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char16_t *form;
  ValueType local_108 [4];
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  this_00 = (functionInfo->functionBodyImpl).ptr;
  if ((this_00 == (FunctionProxy *)0x0) ||
     (bVar3 = Js::FunctionProxy::IsFunctionBody(this_00), !bVar3)) {
    ValueType::ValueType(local_108);
    GetBuiltInInfo(functionInfo,(OpCode *)local_a8,local_108);
    if ((local_a8[0] == L'\0') && (bVar3 = ValueType::IsUninitialized(local_108), bVar3)) {
      return (FunctionInfo *)0x0;
    }
    if (this->jitMode == FullJit) {
LAB_005113f2:
      if (local_a8[0] == L'\0') {
        return functionInfo;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar4,LVar5);
      if (!bVar3) {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
        LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,GlobOptPhase,uVar4,LVar5);
        if (!bVar3 && !isConstructorCall) {
          return functionInfo;
        }
      }
      return (FunctionInfo *)0x0;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x155,"(this->jitMode == ExecutionMode::FullJit)",
                       "this->jitMode == ExecutionMode::FullJit");
    if (bVar3) {
      *puVar10 = 0;
      goto LAB_005113f2;
    }
LAB_00511963:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (this->isLoopBody == true) {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineInJitLoopBodyPhase,uVar4,LVar5);
    if (bVar3) {
      if (DAT_0145948a != '\x01') {
        return (FunctionInfo *)0x0;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar4,LVar5);
      if (!bVar3) {
        return (FunctionInfo *)0x0;
      }
      iVar6 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )();
      pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_a8);
      Output::Print(L"INLINING: Skip Inline: Jit loop body: %s (%s)\n",CONCAT44(extraout_var,iVar6),
                    pcVar8);
      goto LAB_005115f8;
    }
  }
  pFVar9 = Js::FunctionProxy::GetFunctionBody(this_00);
  if (this->jitMode != FullJit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xfe,"(this->jitMode == ExecutionMode::FullJit)",
                       "this->jitMode == ExecutionMode::FullJit");
    if (!bVar3) goto LAB_00511963;
    *puVar10 = 0;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar9);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar9);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar4,LVar5);
  if (bVar3) {
    return (FunctionInfo *)0x0;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar9);
  unique0x10000bff = pFVar9;
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar9);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,GlobOptPhase,uVar4,LVar5);
  if (bVar3) {
    return (FunctionInfo *)0x0;
  }
  bVar3 = ContinueInliningUserDefinedFunctions(this,this->bytecodeInlinedCount);
  pFVar9 = stack0xffffffffffffffb0;
  if (!bVar3) {
    return (FunctionInfo *)0x0;
  }
  if (this->isInDebugMode != false) {
    return (FunctionInfo *)0x0;
  }
  if (((functionInfo->attributes & (DeferredParse|DeferredDeserialize)) == None) &&
     (pBVar14 = Js::FunctionBody::GetByteCode(stack0xffffffffffffffb0), pBVar14 != (ByteBlock *)0x0)
     ) {
    uVar1 = (pFVar9->super_ParseableFunctionInfo).m_inParamCount;
    if (0xf < uVar1) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar4,LVar5);
      if (!bVar3) {
        return (FunctionInfo *)0x0;
      }
      iVar6 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
      pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
      uVar1 = (pFVar9->super_ParseableFunctionInfo).m_inParamCount;
      iVar7 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      Output::Print(L"INLINING: Skip Inline: Params count greater then MaxInlineeArgoutCount\tInlinee: %s (%s)\tParamcount: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                    ,CONCAT44(extraout_var_02,iVar6),pcVar8,(ulong)uVar1,0xf,
                    CONCAT44(extraout_var_03,iVar7),pcVar13);
      goto LAB_005115f8;
    }
    if ((uVar1 == 0) &&
       (((pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) == 0)) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar4,LVar5);
      if (!bVar3) {
        return (FunctionInfo *)0x0;
      }
      iVar6 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
      pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
      uVar1 = (pFVar9->super_ParseableFunctionInfo).m_inParamCount;
      iVar7 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      Output::Print(L"INLINING: Skip Inline: Params count is zero!\tInlinee: %s (%s)\tParamcount: %d\tCaller: %s (%s)\n"
                    ,CONCAT44(extraout_var_04,iVar6),pcVar8,(ulong)uVar1,
                    CONCAT44(extraout_var_05,iVar7),pcVar13);
      goto LAB_005115f8;
    }
    if (((pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 8) == 0) {
      bVar3 = Js::FunctionProxy::IsClassConstructor((FunctionProxy *)pFVar9);
      if (!bVar3 || isConstructorCall) {
        bVar3 = DeciderInlineIntoInliner
                          (this,pFVar9,inliner,isConstructorCall,isPolymorphicCall,constantArgInfo,
                           recursiveInlineDepth,allowRecursiveInlining);
        if (!bVar3) {
          return (FunctionInfo *)0x0;
        }
        iVar6 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
        pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                           ((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
        uVar4 = Js::FunctionBody::GetByteCodeCount(pFVar9);
        TraceInlining(inliner,(char16 *)CONCAT44(extraout_var_06,iVar6),pcVar8,uVar4,this->topFunc,
                      this->bytecodeInlinedCount,pFVar9,(uint)callSiteId,this->isLoopBody,isCallback
                      ,0xffffffff);
        uVar4 = Js::FunctionBody::GetByteCodeCount(pFVar9);
        this->bytecodeInlinedCount = this->bytecodeInlinedCount + uVar4;
        return (pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar4,LVar5);
      if (!bVar3) {
        return (FunctionInfo *)0x0;
      }
      iVar6 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
      uVar11 = CONCAT44(extraout_var_09,iVar6);
      pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
      iVar6 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      uVar12 = CONCAT44(extraout_var_10,iVar6);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      form = 
      L"INLINING: Skip Inline: Class constructor without new keyword\tInlinee: %s (%s)\tCaller: %s (%s)\n"
      ;
    }
    else {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar4,LVar5);
      if (!bVar3) {
        return (FunctionInfo *)0x0;
      }
      iVar6 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
      uVar11 = CONCAT44(extraout_var_07,iVar6);
      pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
      iVar6 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      uVar12 = CONCAT44(extraout_var_08,iVar6);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      form = L"INLINING: Skip Inline: Do not inline\tInlinee: %s (%s)\tCaller: %s (%s)\n";
    }
  }
  else {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar4,LVar5);
    if (!bVar3) {
      return (FunctionInfo *)0x0;
    }
    iVar6 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
    uVar11 = CONCAT44(extraout_var_00,iVar6);
    pcVar8 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
    iVar6 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    uVar12 = CONCAT44(extraout_var_01,iVar6);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
    form = L"INLINING: Skip Inline: No bytecode\tInlinee: %s (%s)\tCaller: %s (%s)\n";
  }
  Output::Print(form,uVar11,pcVar8,uVar12,pcVar13);
LAB_005115f8:
  Output::Flush();
  return (FunctionInfo *)0x0;
}

Assistant:

Js::FunctionInfo *InliningDecider::Inline(Js::FunctionBody *const inliner, 
    Js::FunctionInfo* functionInfo,
    bool isConstructorCall, 
    bool isPolymorphicCall, 
    bool isCallback, 
    uint16 constantArgInfo, 
    Js::ProfileId callSiteId, 
    uint recursiveInlineDepth, 
    bool allowRecursiveInlining)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    Js::FunctionProxy * proxy = functionInfo->GetFunctionProxy();
    if (proxy && proxy->IsFunctionBody())
    {
        if (isLoopBody && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->topFunc))
        {
            INLINE_TESTTRACE_VERBOSE(_u("INLINING: Skip Inline: Jit loop body: %s (%s)\n"), this->topFunc->GetDisplayName(),
                this->topFunc->GetDebugNumberSet(debugStringBuffer));
            return nullptr;
        }

        // Note: disable inline for debugger, as we can't bailout at return from function.
        // Alternative can be generate this bailout as part of inline, which can be done later as perf improvement.
        const auto inlinee = proxy->GetFunctionBody();
        Assert(this->jitMode == ExecutionMode::FullJit);
        if (PHASE_OFF(Js::InlinePhase, inlinee) ||
            PHASE_OFF(Js::GlobOptPhase, inlinee) ||
            !ContinueInliningUserDefinedFunctions(this->bytecodeInlinedCount) ||
            this->isInDebugMode)
        {
            return nullptr;
        }

        if (functionInfo->IsDeferred() || inlinee->GetByteCode() == nullptr)
        {
            // DeferredParse...
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: No bytecode\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

#ifdef _M_IX86
        if (inlinee->GetHasTry())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has try\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }
#endif

        // This is a hard limit as the argOuts array is statically sized.
        if (inlinee->GetInParamsCount() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Params count greater then MaxInlineeArgoutCount\tInlinee: %s (%s)\tParamcount: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetInParamsCount(), Js::InlineeCallInfo::MaxInlineeArgoutCount,
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        // Wasm functions can have no params
        if (inlinee->GetInParamsCount() == 0 && !inlinee->GetIsAsmjsMode())
        {
            // Inline candidate has no params, not even a this pointer.  This can only be the global function,
            // which we shouldn't inline.
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Params count is zero!\tInlinee: %s (%s)\tParamcount: %d\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetInParamsCount(),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        if (inlinee->GetDontInline())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Do not inline\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        // Do not inline a call to a class constructor if it isn't part of a new expression since the call will throw a TypeError anyway.
        if (inlinee->IsClassConstructor() && !isConstructorCall)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Class constructor without new keyword\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        if (!DeciderInlineIntoInliner(inlinee, inliner, isConstructorCall, isPolymorphicCall, constantArgInfo, recursiveInlineDepth, allowRecursiveInlining))
        {
            return nullptr;
        }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        TraceInlining(inliner, inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetByteCodeCount(), this->topFunc, this->bytecodeInlinedCount, inlinee, callSiteId, this->isLoopBody, isCallback);
#endif

        this->bytecodeInlinedCount += inlinee->GetByteCodeCount();
        return inlinee->GetFunctionInfo();
    }

    Js::OpCode builtInInlineCandidateOpCode;
    ValueType builtInReturnType;
    GetBuiltInInfo(functionInfo, &builtInInlineCandidateOpCode, &builtInReturnType);

    if(builtInInlineCandidateOpCode == 0 && builtInReturnType.IsUninitialized())
    {
        return nullptr;
    }

    Assert(this->jitMode == ExecutionMode::FullJit);
    if (builtInInlineCandidateOpCode != 0 &&
        (
            PHASE_OFF(Js::InlinePhase, inliner) ||
            PHASE_OFF(Js::GlobOptPhase, inliner) ||
            isConstructorCall
        ))
    {
        return nullptr;
    }

    // Note: for built-ins at this time we don't have enough data (the instr) to decide whether it's going to be inlined.
    return functionInfo;
}